

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_events_cpp.cpp
# Opt level: O1

void __thiscall Events::resize(Events *this,mfb_window *window,int width,int height)

{
  char *pcVar1;
  uint width_00;
  uint offset_y;
  uint offset_x;
  uint height_00;
  
  if (window == (mfb_window *)0x0) {
    pcVar1 = "";
  }
  else {
    pcVar1 = (char *)mfb_get_user_data(window);
  }
  fprintf(_stdout,"%s > resize: %d, %d\n",pcVar1,(ulong)(uint)width,(ulong)(uint)height);
  offset_x = width - 800U >> 1;
  width_00 = 800;
  if (width < 800) {
    width_00 = width;
  }
  if (width < 0x321) {
    offset_x = 0;
  }
  offset_y = height - 600U >> 1;
  height_00 = 600;
  if (height < 600) {
    height_00 = height;
  }
  if (height < 0x259) {
    offset_y = 0;
  }
  mfb_set_viewport(window,offset_x,offset_y,width_00,height_00);
  return;
}

Assistant:

void resize(struct mfb_window *window, int width, int height) {
        uint32_t x = 0;
        uint32_t y = 0;
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }

        fprintf(stdout, "%s > resize: %d, %d\n", window_title, width, height);
        if(width > WIDTH) {
            x = (width - WIDTH) >> 1;
            width = WIDTH;
        }
        if(height > HEIGHT) {
            y = (height - HEIGHT) >> 1;
            height = HEIGHT;
        }
        mfb_set_viewport(window, x, y, width, height);
    }